

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::BeginFunctionBody(SharedValidator *this,Location *loc,Index func_index)

{
  pointer *ppLVar1;
  pointer pLVar2;
  pointer pTVar3;
  iterator __position;
  ulong uVar4;
  Index IVar5;
  Result RVar6;
  pointer pFVar7;
  ulong uVar8;
  pointer pTVar9;
  TypeVector local_48;
  
  this->expr_loc_ = loc;
  pLVar2 = (this->locals_).
           super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->locals_).
      super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
      ._M_impl.super__Vector_impl_data._M_finish != pLVar2) {
    (this->locals_).
    super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar2;
  }
  uVar4 = (ulong)func_index;
  pFVar7 = (this->funcs_).
           super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(this->funcs_).
                 super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar7 >> 4) *
          -0x5555555555555555;
  if (uVar8 < uVar4 || uVar8 - uVar4 == 0) {
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RVar6 = TypeChecker::BeginFunction(&this->typechecker_,&local_48);
    if ((LocalDecl)
        local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (LocalDecl)0x0) {
      operator_delete(local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    pTVar9 = *(pointer *)
              &pFVar7[uVar4].params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
               _M_impl;
    pTVar3 = *(pointer *)
              ((long)&pFVar7[uVar4].params.
                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl + 8);
    if (pTVar9 != pTVar3) {
      do {
        __position._M_current =
             (this->locals_).
             super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if ((this->locals_).
            super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
            ._M_impl.super__Vector_impl_data._M_start == __position._M_current) {
          IVar5 = 1;
        }
        else {
          IVar5 = __position._M_current[-1].end + 1;
        }
        local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)CONCAT44(IVar5,pTVar9->enum_);
        if (__position._M_current ==
            (this->locals_).
            super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
          ::_M_realloc_insert<wabt::SharedValidator::LocalDecl>
                    (&this->locals_,__position,(LocalDecl *)&local_48);
        }
        else {
          *__position._M_current =
               (LocalDecl)
               local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
          ppLVar1 = &(this->locals_).
                     super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppLVar1 = *ppLVar1 + 1;
        }
        pTVar9 = pTVar9 + 1;
      } while (pTVar9 != pTVar3);
      pFVar7 = (this->funcs_).
               super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    RVar6 = TypeChecker::BeginFunction(&this->typechecker_,&pFVar7[uVar4].results);
  }
  return (Result)RVar6.enum_;
}

Assistant:

Result SharedValidator::BeginFunctionBody(const Location& loc,
                                          Index func_index) {
  expr_loc_ = &loc;
  locals_.clear();
  if (func_index < funcs_.size()) {
    for (Type type : funcs_[func_index].params) {
      // TODO: Coalesce parameters of the same type?
      locals_.push_back(LocalDecl{type, GetLocalCount() + 1});
    }
    return typechecker_.BeginFunction(funcs_[func_index].results);
  } else {
    // Signature isn't available, use empty.
    return typechecker_.BeginFunction(TypeVector());
  }
}